

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Matches(OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *this,ArgumentTuple *args)

{
  char cVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  cVar1 = (**(code **)(**(long **)(this + 0x18) + 0x20))
                    (*(long **)(this + 0x18),
                     (args->
                     super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                     ).
                     super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                     ._M_head_impl);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(**(long **)(this + 0x30) + 0x20))(*(long **)(this + 0x30),args);
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }